

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_c.cpp
# Opt level: O0

void * cpputest_malloc_location(size_t size,char *file,size_t line)

{
  void *pvVar1;
  size_t line_local;
  char *file_local;
  size_t size_local;
  
  countdown();
  malloc_count = malloc_count + 1;
  pvVar1 = cpputest_malloc_location_with_leak_detection(size,file,line);
  return pvVar1;
}

Assistant:

void* cpputest_malloc_location(size_t size, const char* file, size_t line)
{
    countdown();
    malloc_count++;
    return cpputest_malloc_location_with_leak_detection(size, file, line);
}